

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::NodeLoader15::begin__bind_vertex_input(NodeLoader15 *this)

{
  bind_vertex_input__AttributeData *in_RSI;
  
  begin__bind_vertex_input
            ((NodeLoader15 *)&this[-1].super_IParserImpl15.super_ColladaParserAutoGen15,in_RSI);
  return;
}

Assistant:

bool NodeLoader15::begin__bind_vertex_input( const COLLADASaxFWL15::bind_vertex_input__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__bind_vertex_input(attributeData));
COLLADASaxFWL::bind_vertex_input__AttributeData attrData;
attrData.present_attributes = 0;
attrData.semantic = attributeData.semantic;
attrData.input_semantic = attributeData.input_semantic;
if ( (attributeData.present_attributes & COLLADASaxFWL15::bind_vertex_input__AttributeData::ATTRIBUTE_INPUT_SET_PRESENT) == COLLADASaxFWL15::bind_vertex_input__AttributeData::ATTRIBUTE_INPUT_SET_PRESENT ) {
    attrData.input_set = attributeData.input_set;
    attrData.present_attributes |= COLLADASaxFWL::bind_vertex_input__AttributeData::ATTRIBUTE_INPUT_SET_PRESENT;
} else {
    attrData.input_set = ~0;
}
return mLoader->begin__bind_vertex_input(attrData);
}